

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::FieldMaskUtil::CamelCaseToSnakeCase
          (FieldMaskUtil *this,StringPiece input,string *output)

{
  char *pcVar1;
  char cVar2;
  int i;
  long i_00;
  undefined1 local_40 [8];
  StringPiece input_local;
  
  input_local.ptr_ = input.ptr_;
  ((undefined8 *)input.length_)[1] = 0;
  **(undefined1 **)input.length_ = 0;
  local_40 = (undefined1  [8])this;
  for (i_00 = 0; pcVar1 = input_local.ptr_, i_00 < (long)input_local.ptr_; i_00 = i_00 + 1) {
    cVar2 = StringPiece::operator[]((StringPiece *)local_40,i_00);
    if (cVar2 == '_') break;
    cVar2 = StringPiece::operator[]((StringPiece *)local_40,i_00);
    if (cVar2 < 'A') {
LAB_00321900:
      StringPiece::operator[]((StringPiece *)local_40,i_00);
    }
    else {
      cVar2 = StringPiece::operator[]((StringPiece *)local_40,i_00);
      if ('Z' < cVar2) goto LAB_00321900;
      std::__cxx11::string::push_back((char)input.length_);
      StringPiece::operator[]((StringPiece *)local_40,i_00);
    }
    std::__cxx11::string::push_back((char)input.length_);
  }
  return (long)pcVar1 <= i_00;
}

Assistant:

bool FieldMaskUtil::CamelCaseToSnakeCase(StringPiece input,
                                         std::string* output) {
  output->clear();
  for (int i = 0; i < input.size(); ++i) {
    if (input[i] == '_') {
      // The field name must not contain "_"s.
      return false;
    }
    if (input[i] >= 'A' && input[i] <= 'Z') {
      output->push_back('_');
      output->push_back(input[i] + 'a' - 'A');
    } else {
      output->push_back(input[i]);
    }
  }
  return true;
}